

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<Fad<double>_>::destroy(Vector<Fad<double>_> *this)

{
  Fad<double> *pFVar1;
  double dVar2;
  long lVar3;
  
  pFVar1 = this->ptr_to_data;
  if (pFVar1 != (Fad<double> *)0x0) {
    dVar2 = pFVar1[-1].defaultVal;
    if (dVar2 != 0.0) {
      lVar3 = (long)dVar2 << 5;
      do {
        Fad<double>::~Fad((Fad<double> *)((long)&pFVar1[-1].val_ + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pFVar1[-1].defaultVal,(long)dVar2 << 5 | 8);
  }
  this->num_elts = 0;
  this->ptr_to_data = (Fad<double> *)0x0;
  return;
}

Assistant:

inline void Vector< T >::destroy() 
{
#ifdef DEBUG
    fprintf(stderr,"Vector<>::destroy()         |                   | adr =  %x \n", ptr_to_data);
#endif
    if (ptr_to_data != 0) 
	delete [] ptr_to_data; 
    else {
    }	

    num_elts = 0; ptr_to_data = (T*)0;
}